

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O2

char * GetUSBClassName(U8 classCode)

{
  IdNamePair *pIVar1;
  char *pcVar2;
  undefined7 in_register_00000039;
  IdNamePair srch;
  
  pIVar1 = std::__lower_bound<IdNamePair_const*,IdNamePair,__gnu_cxx::__ops::_Iter_less_val>
                     (ClassCodes,UsageTables);
  if ((pIVar1->id != (U16)CONCAT71(in_register_00000039,classCode)) ||
     (pcVar2 = pIVar1->name, pcVar2 == (char *)0x0)) {
    pcVar2 = "<unknown>";
  }
  return pcVar2;
}

Assistant:

const char* GetUSBClassName( U8 classCode )
{
    const size_t NUM_ITEMS = sizeof( ClassCodes ) / sizeof( IdNamePair );

    IdNamePair srch;
    srch.id = classCode;

    const IdNamePair* res = std::lower_bound( ClassCodes, ClassCodes + NUM_ITEMS, srch );

    if( res->id == classCode && res->name != NULL )
        return res->name;

    return "<unknown>";
}